

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int gc_printobj(lua_State *L)

{
  StkId pTVar1;
  GCObject *obj;
  TValue *o;
  lua_State *L_local;
  
  luaL_checkany(L,1);
  pTVar1 = L->ci->func;
  if ((pTVar1[1].tt_ & 0x8000) == 0) {
    printf("no collectable\n");
  }
  else {
    if ((pTVar1[1].tt_ & 0x8000) == 0) {
      __assert_fail("(((o)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x301,"int gc_printobj(lua_State *)");
    }
    printobj(L->l_G,pTVar1[1].value_.gc);
    printf(anon_var_dwarf_1578f + 5);
  }
  return 0;
}

Assistant:

static int gc_printobj (lua_State *L) {
  TValue *o;
  luaL_checkany(L, 1);
  o = obj_at(L, 1);
  if (!iscollectable(o))
    printf("no collectable\n");
  else {
    GCObject *obj = gcvalue(o);
    printobj(G(L), obj);
    printf("\n");
  }
  return 0;
}